

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

size_t __thiscall
spvtools::opt::analysis::Type::ComputeHashValue(Type *this,size_t hash,SeenTypes *seen)

{
  Type ***pppTVar1;
  pointer pvVar2;
  int iVar3;
  iterator ppTVar4;
  Type **ppTVar5;
  long *plVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  Type ***pppTVar7;
  size_t hash_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *d;
  pointer vals;
  Type *local_30;
  undefined4 extraout_var;
  
  pppTVar1 = (Type ***)
             (seen->large_data_)._M_t.
             super___uniq_ptr_impl<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
             .
             super__Head_base<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_false>
             ._M_head_impl;
  pppTVar7 = &seen->small_data_;
  if (pppTVar1 != (Type ***)0x0) {
    pppTVar7 = pppTVar1;
  }
  ppTVar5 = *pppTVar7;
  ppTVar4 = utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::end(seen);
  local_30 = this;
  ppTVar5 = std::
            __find_if<spvtools::opt::analysis::Type_const**,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::analysis::Type_const*const>>
                      (ppTVar5,ppTVar4);
  ppTVar4 = utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::end(seen);
  if (ppTVar5 == ppTVar4) {
    local_30 = this;
    utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::push_back(seen,&local_30);
    hash_00 = (hash >> 2) + hash * 0x40 + 0x9e3779b9 + (ulong)this->kind_ ^ hash;
    pvVar2 = (this->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (vals = (this->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; vals != pvVar2; vals = vals + 1) {
      hash_00 = utils::hash_combine<unsigned_int>(hash_00,vals);
    }
    switch(this->kind_) {
    case kVoid:
      iVar3 = (*this->_vptr_Type[6])(this);
      plVar6 = (long *)CONCAT44(extraout_var,iVar3);
      break;
    case kBool:
      iVar3 = (*this->_vptr_Type[8])(this);
      plVar6 = (long *)CONCAT44(extraout_var_13,iVar3);
      break;
    case kInteger:
      iVar3 = (*this->_vptr_Type[10])(this);
      plVar6 = (long *)CONCAT44(extraout_var_09,iVar3);
      break;
    case kFloat:
      iVar3 = (*this->_vptr_Type[0xc])(this);
      plVar6 = (long *)CONCAT44(extraout_var_11,iVar3);
      break;
    case kVector:
      iVar3 = (*this->_vptr_Type[0xe])(this);
      plVar6 = (long *)CONCAT44(extraout_var_04,iVar3);
      break;
    case kMatrix:
      iVar3 = (*this->_vptr_Type[0x10])(this);
      plVar6 = (long *)CONCAT44(extraout_var_17,iVar3);
      break;
    case kImage:
      iVar3 = (*this->_vptr_Type[0x12])(this);
      plVar6 = (long *)CONCAT44(extraout_var_20,iVar3);
      break;
    case kSampler:
      iVar3 = (*this->_vptr_Type[0x14])(this);
      plVar6 = (long *)CONCAT44(extraout_var_12,iVar3);
      break;
    case kSampledImage:
      iVar3 = (*this->_vptr_Type[0x16])(this);
      plVar6 = (long *)CONCAT44(extraout_var_23,iVar3);
      break;
    case kArray:
      iVar3 = (*this->_vptr_Type[0x18])(this);
      plVar6 = (long *)CONCAT44(extraout_var_06,iVar3);
      break;
    case kRuntimeArray:
      iVar3 = (*this->_vptr_Type[0x1a])(this);
      plVar6 = (long *)CONCAT44(extraout_var_22,iVar3);
      break;
    case kNodePayloadArrayAMDX:
      iVar3 = (*this->_vptr_Type[0x1c])(this);
      plVar6 = (long *)CONCAT44(extraout_var_03,iVar3);
      break;
    case kStruct:
      iVar3 = (*this->_vptr_Type[0x1e])(this);
      plVar6 = (long *)CONCAT44(extraout_var_05,iVar3);
      break;
    case kOpaque:
      iVar3 = (*this->_vptr_Type[0x20])(this);
      plVar6 = (long *)CONCAT44(extraout_var_19,iVar3);
      break;
    case kPointer:
      iVar3 = (*this->_vptr_Type[0x22])(this);
      plVar6 = (long *)CONCAT44(extraout_var_02,iVar3);
      break;
    case kFunction:
      iVar3 = (*this->_vptr_Type[0x24])(this);
      plVar6 = (long *)CONCAT44(extraout_var_10,iVar3);
      break;
    case kEvent:
      iVar3 = (*this->_vptr_Type[0x26])(this);
      plVar6 = (long *)CONCAT44(extraout_var_01,iVar3);
      break;
    case kDeviceEvent:
      iVar3 = (*this->_vptr_Type[0x28])(this);
      plVar6 = (long *)CONCAT44(extraout_var_15,iVar3);
      break;
    case kReserveId:
      iVar3 = (*this->_vptr_Type[0x2a])(this);
      plVar6 = (long *)CONCAT44(extraout_var_21,iVar3);
      break;
    case kQueue:
      iVar3 = (*this->_vptr_Type[0x2c])(this);
      plVar6 = (long *)CONCAT44(extraout_var_26,iVar3);
      break;
    case kPipe:
      iVar3 = (*this->_vptr_Type[0x2e])(this);
      plVar6 = (long *)CONCAT44(extraout_var_16,iVar3);
      break;
    case kForwardPointer:
      iVar3 = (*this->_vptr_Type[0x30])(this);
      plVar6 = (long *)CONCAT44(extraout_var_18,iVar3);
      break;
    case kPipeStorage:
      iVar3 = (*this->_vptr_Type[0x32])(this);
      plVar6 = (long *)CONCAT44(extraout_var_25,iVar3);
      break;
    case kNamedBarrier:
      iVar3 = (*this->_vptr_Type[0x34])(this);
      plVar6 = (long *)CONCAT44(extraout_var_27,iVar3);
      break;
    case kAccelerationStructureNV:
      iVar3 = (*this->_vptr_Type[0x36])(this);
      plVar6 = (long *)CONCAT44(extraout_var_08,iVar3);
      break;
    case kCooperativeMatrixNV:
      iVar3 = (*this->_vptr_Type[0x38])(this);
      plVar6 = (long *)CONCAT44(extraout_var_07,iVar3);
      break;
    case kCooperativeMatrixKHR:
      iVar3 = (*this->_vptr_Type[0x3a])(this);
      plVar6 = (long *)CONCAT44(extraout_var_30,iVar3);
      break;
    case kCooperativeVectorNV:
      iVar3 = (*this->_vptr_Type[0x3c])(this);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar3);
      break;
    case kRayQueryKHR:
      iVar3 = (*this->_vptr_Type[0x3e])(this);
      plVar6 = (long *)CONCAT44(extraout_var_28,iVar3);
      break;
    case kHitObjectNV:
      iVar3 = (*this->_vptr_Type[0x40])(this);
      plVar6 = (long *)CONCAT44(extraout_var_29,iVar3);
      break;
    case kTensorLayoutNV:
      iVar3 = (*this->_vptr_Type[0x42])(this);
      plVar6 = (long *)CONCAT44(extraout_var_24,iVar3);
      break;
    case kTensorViewNV:
      iVar3 = (*this->_vptr_Type[0x44])(this);
      plVar6 = (long *)CONCAT44(extraout_var_14,iVar3);
      break;
    default:
      __assert_fail("false && \"Unhandled type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/types.cpp"
                    ,0xfc,
                    "size_t spvtools::opt::analysis::Type::ComputeHashValue(size_t, SeenTypes *) const"
                   );
    }
    hash = (**(code **)(*plVar6 + 0x228))(plVar6,hash_00,seen);
    utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::pop_back(seen);
  }
  return hash;
}

Assistant:

size_t Type::ComputeHashValue(size_t hash, SeenTypes* seen) const {
  // Linear search through a dense, cache coherent vector is faster than O(log
  // n) search in a complex data structure (eg std::set) for the generally small
  // number of nodes.  It also skips the overhead of an new/delete per Type
  // (when inserting/removing from a set).
  if (std::find(seen->begin(), seen->end(), this) != seen->end()) {
    return hash;
  }

  seen->push_back(this);

  hash = hash_combine(hash, uint32_t(kind_));
  for (const auto& d : decorations_) {
    hash = hash_combine(hash, d);
  }

  switch (kind_) {
#define DeclareKindCase(type)                             \
  case k##type:                                           \
    hash = As##type()->ComputeExtraStateHash(hash, seen); \
    break
    DeclareKindCase(Void);
    DeclareKindCase(Bool);
    DeclareKindCase(Integer);
    DeclareKindCase(Float);
    DeclareKindCase(Vector);
    DeclareKindCase(Matrix);
    DeclareKindCase(Image);
    DeclareKindCase(Sampler);
    DeclareKindCase(SampledImage);
    DeclareKindCase(Array);
    DeclareKindCase(RuntimeArray);
    DeclareKindCase(NodePayloadArrayAMDX);
    DeclareKindCase(Struct);
    DeclareKindCase(Opaque);
    DeclareKindCase(Pointer);
    DeclareKindCase(Function);
    DeclareKindCase(Event);
    DeclareKindCase(DeviceEvent);
    DeclareKindCase(ReserveId);
    DeclareKindCase(Queue);
    DeclareKindCase(Pipe);
    DeclareKindCase(ForwardPointer);
    DeclareKindCase(PipeStorage);
    DeclareKindCase(NamedBarrier);
    DeclareKindCase(AccelerationStructureNV);
    DeclareKindCase(CooperativeMatrixNV);
    DeclareKindCase(CooperativeMatrixKHR);
    DeclareKindCase(CooperativeVectorNV);
    DeclareKindCase(RayQueryKHR);
    DeclareKindCase(HitObjectNV);
    DeclareKindCase(TensorLayoutNV);
    DeclareKindCase(TensorViewNV);
#undef DeclareKindCase
    default:
      assert(false && "Unhandled type");
      break;
  }

  seen->pop_back();
  return hash;
}